

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O2

void __thiscall leveldb::AddBoundaryInputsTest::~AddBoundaryInputsTest(AddBoundaryInputsTest *this)

{
  pointer ppFVar1;
  pointer ppFVar2;
  FileMetaData *this_00;
  size_t i;
  ulong uVar3;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__AddBoundaryInputsTest_0015c888;
  uVar3 = 0;
  while( true ) {
    ppFVar1 = (this->all_files_).
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar2 = (this->all_files_).
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppFVar2 - (long)ppFVar1 >> 3) <= uVar3) break;
    this_00 = ppFVar1[uVar3];
    if (this_00 != (FileMetaData *)0x0) {
      FileMetaData::~FileMetaData(this_00);
    }
    operator_delete(this_00);
    uVar3 = uVar3 + 1;
  }
  if (ppFVar2 != ppFVar1) {
    (this->all_files_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppFVar1;
  }
  Comparator::~Comparator(&(this->icmp_).super_Comparator);
  std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
  ~_Vector_base(&(this->all_files_).
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               );
  std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
  ~_Vector_base(&(this->compaction_files_).
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               );
  std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
  ~_Vector_base(&(this->level_files_).
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               );
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

~AddBoundaryInputsTest() {
    for (size_t i = 0; i < all_files_.size(); ++i) {
      delete all_files_[i];
    }
    all_files_.clear();
  }